

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.h
# Opt level: O0

fio_str_info_s *
fio_str_resize(fio_str_info_s *__return_storage_ptr__,fio_str_s_conflict *s,size_t size)

{
  uintptr_t uVar1;
  fio_str_info_s local_48;
  fio_str_info_s local_30;
  size_t local_18;
  size_t size_local;
  fio_str_s_conflict *s_local;
  
  local_18 = size;
  size_local = (size_t)s;
  if ((s == (fio_str_s_conflict *)0x0) || (s->frozen != '\0')) {
    fio_str_info(__return_storage_ptr__,s);
  }
  else {
    if ((s->small == '\0') && (s->data != (char *)0x0)) {
      if (s->capa <= size) {
        uVar1 = fio_ct_if2((uintptr_t)s->dealloc,s->capa,s->len);
        *(uintptr_t *)(size_local + 0x18) = uVar1;
        fio_str_capa_assert(&local_48,(fio_str_s_conflict *)size_local,local_18);
      }
    }
    else {
      if (size < 0x2e) {
        s->small = (byte)(size << 1) | 1;
        s->reserved[size] = '\0';
        __return_storage_ptr__->capa = 0x2d;
        __return_storage_ptr__->len = size;
        __return_storage_ptr__->data = (char *)s->reserved;
        return __return_storage_ptr__;
      }
      s->small = '[';
      fio_str_capa_assert(&local_30,s,size);
    }
    *(size_t *)(size_local + 0x18) = local_18;
    *(undefined1 *)(*(long *)(size_local + 0x28) + local_18) = 0;
    __return_storage_ptr__->capa = *(size_t *)(size_local + 0x10);
    __return_storage_ptr__->len = local_18;
    __return_storage_ptr__->data = *(char **)(size_local + 0x28);
  }
  return __return_storage_ptr__;
}

Assistant:

inline FIO_FUNC fio_str_info_s fio_str_resize(fio_str_s *s, size_t size) {
  if (!s || s->frozen) {
    return fio_str_info(s);
  }
  if (s->small || !s->data) {
    if (size < FIO_STR_SMALL_CAPA) {
      s->small = (uint8_t)(((size << 1) | 1) & 0xFF);
      FIO_STR_SMALL_DATA(s)[size] = 0;
      return (fio_str_info_s){.capa = (FIO_STR_SMALL_CAPA - 1),
                              .len = size,
                              .data = FIO_STR_SMALL_DATA(s)};
    }
    s->small = (uint8_t)((((FIO_STR_SMALL_CAPA - 1) << 1) | 1) & 0xFF);
    fio_str_capa_assert(s, size);
    goto big;
  }
  if (size >= s->capa) {
    s->len = fio_ct_if2((uintptr_t)s->dealloc, s->capa, s->len);
    fio_str_capa_assert(s, size);
  }

big:
  s->len = size;
  s->data[size] = 0;
  return (fio_str_info_s){.capa = s->capa, .len = size, .data = s->data};
}